

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-dll2.h
# Opt level: O1

void lws_dll2_add_head(lws_dll2 *d,lws_dll2_owner *owner)

{
  if (d->owner == (lws_dll2_owner *)0x0) {
    if (owner->head != d) {
      d->next = owner->head;
    }
    if (d->next != (lws_dll2 *)0x0) {
      d->next->prev = d;
    }
    d->prev = (lws_dll2 *)0x0;
    owner->head = d;
    if (owner->tail == (lws_dll2 *)0x0) {
      owner->tail = d;
    }
    d->owner = owner;
    owner->count = owner->count + 1;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                ,0x2f,"void lws_dll2_add_head(struct lws_dll2 *, struct lws_dll2_owner *)");
}

Assistant:

static LWS_INLINE int
lws_dll2_is_detached(const struct lws_dll2 *d) { return !d->owner; }